

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall
xatlas::internal::ThreadLocal<xatlas::internal::UniformGrid2>::ThreadLocal
          (ThreadLocal<xatlas::internal::UniformGrid2> *this)

{
  uint uVar1;
  UniformGrid2 *pUVar2;
  char *in_RCX;
  int extraout_EDX;
  long lVar3;
  int in_R8D;
  
  uVar1 = std::thread::hardware_concurrency();
  pUVar2 = (UniformGrid2 *)Realloc((void *)0x0,(ulong)uVar1 * 0xa0,extraout_EDX,in_RCX,in_R8D);
  this->m_array = pUVar2;
  if (uVar1 != 0) {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)&(pUVar2->m_edges).m_base.buffer + lVar3) = 0;
      *(undefined8 *)((long)&(pUVar2->m_edges).m_base.elementSize + lVar3) = 4;
      *(undefined4 *)((long)&(pUVar2->m_edges).m_base.capacity + lVar3) = 0;
      *(undefined8 *)((long)&(pUVar2->m_cellDataOffsets).m_base.buffer + lVar3) = 0;
      *(undefined8 *)((long)&(pUVar2->m_cellDataOffsets).m_base.elementSize + lVar3) = 4;
      *(undefined4 *)((long)&(pUVar2->m_cellDataOffsets).m_base.capacity + lVar3) = 0;
      *(undefined8 *)((long)&(pUVar2->m_cellData).m_base.buffer + lVar3) = 0;
      *(undefined8 *)((long)&(pUVar2->m_cellData).m_base.elementSize + lVar3) = 4;
      *(undefined4 *)((long)&(pUVar2->m_cellData).m_base.capacity + lVar3) = 0;
      *(undefined8 *)((long)&(pUVar2->m_potentialEdges).m_base.buffer + lVar3) = 0;
      *(undefined8 *)((long)&(pUVar2->m_potentialEdges).m_base.elementSize + lVar3) = 4;
      *(undefined4 *)((long)&(pUVar2->m_potentialEdges).m_base.capacity + lVar3) = 0;
      *(undefined8 *)((long)&(pUVar2->m_traversedCellOffsets).m_base.buffer + lVar3) = 0;
      *(undefined8 *)((long)&(pUVar2->m_traversedCellOffsets).m_base.elementSize + lVar3) = 4;
      *(undefined4 *)((long)&(pUVar2->m_traversedCellOffsets).m_base.capacity + lVar3) = 0;
      lVar3 = lVar3 + 0xa0;
    } while ((ulong)uVar1 * 0xa0 != lVar3);
  }
  return;
}

Assistant:

ThreadLocal()
	{
#if XA_MULTITHREADED
		const uint32_t n = std::thread::hardware_concurrency();
#else
		const uint32_t n = 1;
#endif
		m_array = XA_ALLOC_ARRAY(MemTag::Default, T, n);
		for (uint32_t i = 0; i < n; i++)
			new (&m_array[i]) T;
	}